

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

PropertyQueryFlags __thiscall
Js::JavascriptNativeIntArray::GetItemQuery
          (JavascriptNativeIntArray *this,Var originalInstance,uint32 index,Var *value,
          ScriptContext *requestContext)

{
  PropertyQueryFlags PVar1;
  ScriptContext *requestContext_00;
  
  requestContext_00 = (ScriptContext *)value;
  JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(this);
  PVar1 = DirectGetVarItemAt(this,index,value,requestContext_00);
  return PVar1;
}

Assistant:

PropertyQueryFlags JavascriptNativeIntArray::GetItemQuery(Var originalInstance, uint32 index, Var* value, ScriptContext* requestContext)
    {
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(this);
#endif
        return JavascriptConversion::BooleanToPropertyQueryFlags(JavascriptNativeIntArray::DirectGetVarItemAt(index, value, requestContext));
    }